

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_interface.h
# Opt level: O0

int katherine_cmd(katherine_udp_t *udp,void *buffer,size_t count)

{
  int res;
  size_t count_local;
  void *buffer_local;
  katherine_udp_t *udp_local;
  
  udp_local._4_4_ = katherine_udp_send_exact(udp,buffer,count);
  if (udp_local._4_4_ == 0) {
    udp_local._4_4_ = 0;
  }
  return udp_local._4_4_;
}

Assistant:

static inline int
katherine_cmd(katherine_udp_t* udp, const void* buffer, size_t count)
{
    int res;

    res = katherine_udp_send_exact(udp, buffer, count);
    if (res) goto err;

    return 0;

err:
    return res;
}